

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O2

size_t __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::NextDecodedChar
          (NumericCharacterEntity *this,stringstream *ss,string *s,size_t start)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  
  pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
  if (*pcVar2 == '#') {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
    bVar3 = *pcVar2 - 0x30;
    if (bVar3 < 10) {
      sVar4 = start + 3;
      pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
      while (cVar1 = *pcVar2, cVar1 < ':') {
        sVar4 = sVar4 + 1;
        if (sVar4 == s->_M_string_length) goto LAB_001c40a6;
        bVar3 = (cVar1 + bVar3 * '\n') - 0x30;
        pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
      }
      if (cVar1 == ';') {
        std::operator<<((ostream *)(ss + 0x10),bVar3);
        return sVar4;
      }
    }
  }
LAB_001c40a6:
  std::operator<<((ostream *)(ss + 0x10),'&');
  return start;
}

Assistant:

size_t SubjectFormatter::NumericCharacterEntity::NextDecodedChar(std::stringstream &ss, std::string s, size_t start)
{
    size_t i = start + 1;
    char c = s.at(i++);

    if (c == '#')
    {
        c = s.at(i++);

        if (c >= '0' && c <= '9')
        {
            int code = c - '0';

            for (c = s.at(i++); c <= '9'; c = s.at(i++))
            {
                if (i == s.length()) { break; }

                code *= 10;
                code += c - '0';
            }

            if (c == ';')
            {
                ss << (char) code;
                return i - 1;
            }
        }
    }

    ss << '&';
    return start;
}